

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O3

int xmlwrite_time(archive_write *a,xml_writer *writer,char *key,time_t t,int z)

{
  int iVar1;
  size_t sVar2;
  char timestr [100];
  tm tm;
  time_t local_d0;
  char local_c8 [104];
  tm local_60;
  
  local_d0 = t;
  gmtime_r(&local_d0,&local_60);
  local_c8[0] = '\0';
  local_c8[1] = '\0';
  local_c8[2] = '\0';
  local_c8[3] = '\0';
  local_c8[4] = '\0';
  local_c8[5] = '\0';
  local_c8[6] = '\0';
  local_c8[7] = '\0';
  local_c8[8] = '\0';
  local_c8[9] = '\0';
  local_c8[10] = '\0';
  local_c8[0xb] = '\0';
  local_c8[0xc] = '\0';
  local_c8[0xd] = '\0';
  local_c8[0xe] = '\0';
  local_c8[0xf] = '\0';
  local_c8[0x10] = '\0';
  local_c8[0x11] = '\0';
  local_c8[0x12] = '\0';
  local_c8[0x13] = '\0';
  local_c8[0x14] = '\0';
  local_c8[0x15] = '\0';
  local_c8[0x16] = '\0';
  local_c8[0x17] = '\0';
  local_c8[0x18] = '\0';
  local_c8[0x19] = '\0';
  local_c8[0x1a] = '\0';
  local_c8[0x1b] = '\0';
  local_c8[0x1c] = '\0';
  local_c8[0x1d] = '\0';
  local_c8[0x1e] = '\0';
  local_c8[0x1f] = '\0';
  local_c8[0x20] = '\0';
  local_c8[0x21] = '\0';
  local_c8[0x22] = '\0';
  local_c8[0x23] = '\0';
  local_c8[0x24] = '\0';
  local_c8[0x25] = '\0';
  local_c8[0x26] = '\0';
  local_c8[0x27] = '\0';
  local_c8[0x28] = '\0';
  local_c8[0x29] = '\0';
  local_c8[0x2a] = '\0';
  local_c8[0x2b] = '\0';
  local_c8[0x2c] = '\0';
  local_c8[0x2d] = '\0';
  local_c8[0x2e] = '\0';
  local_c8[0x2f] = '\0';
  local_c8[0x30] = '\0';
  local_c8[0x31] = '\0';
  local_c8[0x32] = '\0';
  local_c8[0x33] = '\0';
  local_c8[0x34] = '\0';
  local_c8[0x35] = '\0';
  local_c8[0x36] = '\0';
  local_c8[0x37] = '\0';
  local_c8[0x38] = '\0';
  local_c8[0x39] = '\0';
  local_c8[0x3a] = '\0';
  local_c8[0x3b] = '\0';
  local_c8[0x3c] = '\0';
  local_c8[0x3d] = '\0';
  local_c8[0x3e] = '\0';
  local_c8[0x3f] = '\0';
  local_c8[0x40] = '\0';
  local_c8[0x41] = '\0';
  local_c8[0x42] = '\0';
  local_c8[0x43] = '\0';
  local_c8[0x44] = '\0';
  local_c8[0x45] = '\0';
  local_c8[0x46] = '\0';
  local_c8[0x47] = '\0';
  local_c8[0x48] = '\0';
  local_c8[0x49] = '\0';
  local_c8[0x4a] = '\0';
  local_c8[0x4b] = '\0';
  local_c8[0x4c] = '\0';
  local_c8[0x4d] = '\0';
  local_c8[0x4e] = '\0';
  local_c8[0x4f] = '\0';
  local_c8[0x50] = '\0';
  local_c8[0x51] = '\0';
  local_c8[0x52] = '\0';
  local_c8[0x53] = '\0';
  local_c8[0x54] = '\0';
  local_c8[0x55] = '\0';
  local_c8[0x56] = '\0';
  local_c8[0x57] = '\0';
  local_c8[0x58] = '\0';
  local_c8[0x59] = '\0';
  local_c8[0x5a] = '\0';
  local_c8[0x5b] = '\0';
  local_c8[0x5c] = '\0';
  local_c8[0x5d] = '\0';
  local_c8[0x5e] = '\0';
  local_c8[0x5f] = '\0';
  local_c8[0x60] = '\0';
  local_c8[0x61] = '\0';
  local_c8[0x62] = '\0';
  local_c8[99] = '\0';
  strftime(local_c8,100,"%Y-%m-%dT%H:%M:%S",&local_60);
  if (z != 0) {
    sVar2 = strlen(local_c8);
    (local_c8 + sVar2)[0] = 'Z';
    (local_c8 + sVar2)[1] = '\0';
  }
  iVar1 = xmlwrite_string(a,writer,key,local_c8);
  return iVar1;
}

Assistant:

static int
xmlwrite_time(struct archive_write *a, struct xml_writer *writer,
	const char *key, time_t t, int z)
{
	char timestr[100];
	struct tm tm;

#if defined(HAVE_GMTIME_S)
	gmtime_s(&tm, &t);
#elif defined(HAVE_GMTIME_R)
	gmtime_r(&t, &tm);
#else
	memcpy(&tm, gmtime(&t), sizeof(tm));
#endif
	memset(&timestr, 0, sizeof(timestr));
	/* Do not use %F and %T for portability. */
	strftime(timestr, sizeof(timestr), "%Y-%m-%dT%H:%M:%S", &tm);
	if (z)
		strcat(timestr, "Z");
	return (xmlwrite_string(a, writer, key, timestr));
}